

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::Type> *
wasm::WATParser::anon_unknown_11::
valtype<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx)

{
  ParseInput *this;
  __index_type *__rhs;
  bool bVar1;
  bool bVar2;
  Nullability extraout_EDX;
  Nullability extraout_EDX_00;
  Nullability nullability;
  Nullability extraout_EDX_01;
  Nullability extraout_EDX_02;
  Nullability extraout_EDX_03;
  Nullability extraout_EDX_04;
  Nullability nullability_00;
  HeapTypeT ht;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string_view expected_13;
  string_view expected_14;
  string_view expected_15;
  string_view expected_16;
  string_view expected_17;
  string_view expected_18;
  string_view expected_19;
  TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx> *pTStack_120;
  string local_110;
  allocator<char> local_f0 [32];
  undefined1 local_d0 [8];
  Result<wasm::HeapType> type_1;
  Result<wasm::HeapType> _val;
  MaybeResult<wasm::Type> type;
  Result<wasm::HeapType> type_2;
  
  this = &ctx->in;
  expected._M_str = "i32";
  expected._M_len = 3;
  bVar1 = ParseInput::takeKeyword(this,expected);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 2;
LAB_00a7d136:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x20) = '\0';
    return __return_storage_ptr__;
  }
  expected_00._M_str = "i64";
  expected_00._M_len = 3;
  bVar1 = ParseInput::takeKeyword(this,expected_00);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 3;
    goto LAB_00a7d136;
  }
  expected_01._M_str = "f32";
  expected_01._M_len = 3;
  bVar1 = ParseInput::takeKeyword(this,expected_01);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 4;
    goto LAB_00a7d136;
  }
  expected_02._M_str = "f64";
  expected_02._M_len = 3;
  bVar1 = ParseInput::takeKeyword(this,expected_02);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 5;
    goto LAB_00a7d136;
  }
  expected_03._M_str = "v128";
  expected_03._M_len = 4;
  bVar1 = ParseInput::takeKeyword(this,expected_03);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 6;
    goto LAB_00a7d136;
  }
  expected_04._M_str = "funcref";
  expected_04._M_len = 7;
  bVar1 = ParseInput::takeKeyword(this,expected_04);
  if (bVar1) {
    pTStack_120 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx> *
                  )0x1;
    nullability = extraout_EDX;
  }
  else {
    expected_05._M_str = "externref";
    expected_05._M_len = 9;
    bVar1 = ParseInput::takeKeyword(this,expected_05);
    if (bVar1) {
      pTStack_120 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                     *)0x0;
      nullability = extraout_EDX_00;
    }
    else {
      expected_06._M_str = "anyref";
      expected_06._M_len = 6;
      bVar1 = ParseInput::takeKeyword(this,expected_06);
      if (bVar1) {
        pTStack_120 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                       *)0x2;
        nullability = extraout_EDX_01;
      }
      else {
        expected_07._M_str = "eqref";
        expected_07._M_len = 5;
        bVar1 = ParseInput::takeKeyword(this,expected_07);
        if (bVar1) {
          pTStack_120 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                         *)0x3;
          nullability = extraout_EDX_02;
        }
        else {
          expected_08._M_str = "i31ref";
          expected_08._M_len = 6;
          bVar1 = ParseInput::takeKeyword(this,expected_08);
          if (bVar1) {
            pTStack_120 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                           *)0x4;
            nullability = extraout_EDX_03;
          }
          else {
            expected_09._M_str = "structref";
            expected_09._M_len = 9;
            bVar1 = ParseInput::takeKeyword(this,expected_09);
            if (!bVar1) {
              expected_10._M_str = "arrayref";
              expected_10._M_len = 8;
              bVar1 = ParseInput::takeKeyword(this,expected_10);
              if (bVar1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)
                           ((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20),"arrayref not yet supported",(allocator<char> *)local_d0);
                ParseInput::err((Err *)((long)&type.val.
                                               super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                               .
                                               super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                               .
                                               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                               .
                                               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       + 0x20),this,
                                (string *)
                                ((long)&type_1.val.
                                        super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        .
                                        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        .
                                        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                + 0x20));
                std::__detail::__variant::
                _Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>::
                _Variant_storage<2ul,wasm::WATParser::Err>
                          ((_Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>
                            *)((long)&_val.val.
                                      super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                      .
                                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                      .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                              0x20),(__index_type *)
                                    ((long)&type.val.
                                            super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            .
                                            super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            .
                                            super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            .
                                            super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    + 0x20));
                std::__cxx11::string::~string
                          ((string *)
                           ((long)&type.val.
                                   super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20));
                std::__cxx11::string::~string
                          ((string *)
                           ((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20));
                goto LAB_00a7d199;
              }
              expected_11._M_str = "ref";
              expected_11._M_len = 3;
              bVar1 = ParseInput::takeSExprStart(this,expected_11);
              if (!bVar1) {
                type.val.
                super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                ._M_u._24_1_ = 1;
                goto LAB_00a7d199;
              }
              expected_12._M_str = "null";
              expected_12._M_len = 4;
              bVar1 = ParseInput::takeKeyword(this,expected_12);
              expected_13._M_str = "func";
              expected_13._M_len = 4;
              bVar2 = ParseInput::takeKeyword(this,expected_13);
              if (bVar2) {
                local_d0 = (undefined1  [8])0x1;
LAB_00a7d46d:
                type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 0;
              }
              else {
                expected_14._M_str = "any";
                expected_14._M_len = 3;
                bVar2 = ParseInput::takeKeyword(this,expected_14);
                if (bVar2) {
                  local_d0 = (undefined1  [8])0x2;
                  goto LAB_00a7d46d;
                }
                expected_15._M_str = "extern";
                expected_15._M_len = 6;
                bVar2 = ParseInput::takeKeyword(this,expected_15);
                if (bVar2) {
                  local_d0 = (undefined1  [8])0x0;
                  goto LAB_00a7d46d;
                }
                expected_16._M_str = "eq";
                expected_16._M_len = 2;
                bVar2 = ParseInput::takeKeyword(this,expected_16);
                if (bVar2) {
                  local_d0 = (undefined1  [8])0x3;
                  goto LAB_00a7d46d;
                }
                expected_17._M_str = "i31";
                expected_17._M_len = 3;
                bVar2 = ParseInput::takeKeyword(this,expected_17);
                if (bVar2) {
                  local_d0 = (undefined1  [8])0x4;
                  goto LAB_00a7d46d;
                }
                expected_18._M_str = "struct";
                expected_18._M_len = 6;
                bVar2 = ParseInput::takeKeyword(this,expected_18);
                if (bVar2) {
                  local_d0 = (undefined1  [8])0x5;
                  goto LAB_00a7d46d;
                }
                expected_19._M_str = "array";
                expected_19._M_len = 5;
                bVar2 = ParseInput::takeKeyword(this,expected_19);
                if (bVar2) {
                  local_d0 = (undefined1  [8])0x6;
                  goto LAB_00a7d46d;
                }
                __rhs = (__index_type *)
                        ((long)&type.val.
                                super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                        + 0x20);
                typeidx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                          ((Result<wasm::HeapType> *)__rhs,ctx);
                std::__detail::__variant::
                _Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::_Copy_ctor_base
                          ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                           ((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20),(_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                                 __rhs);
                if (_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_
                    == '\x01') {
                  std::__cxx11::string::string
                            ((string *)local_f0,
                             (string *)
                             ((long)&type_1.val.
                                     super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                             0x20));
                  std::__detail::__variant::
                  _Variant_storage<false,wasm::HeapType,wasm::WATParser::Err>::
                  _Variant_storage<1ul,wasm::WATParser::Err>
                            ((_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err> *)local_d0
                             ,local_f0);
                  std::__cxx11::string::~string((string *)local_f0);
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                             ((long)&type_1.val.
                                     super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                             0x20));
                }
                else {
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                             ((long)&type_1.val.
                                     super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                             0x20));
                  local_d0 = (undefined1  [8])
                             type.val.
                             super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             ._32_8_;
                  type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 0
                  ;
                }
                std::__detail::__variant::
                _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                          ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                           ((long)&type.val.
                                   super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20));
              }
              std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                                ((long)&type.val.
                                        super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                        .
                                        super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                        .
                                        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                        .
                                        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                + 0x20),(_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>
                                         *)local_d0);
              if (type_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ ==
                  '\x01') {
                std::__cxx11::string::string
                          ((string *)
                           ((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20),(string *)
                                 ((long)&type.val.
                                         super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 + 0x20));
                std::__detail::__variant::
                _Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>::
                _Variant_storage<2ul,wasm::WATParser::Err>
                          ((_Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>
                            *)((long)&_val.val.
                                      super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                      .
                                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                      .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                              0x20),(__index_type *)
                                    ((long)&type_1.val.
                                            super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                    + 0x20));
                std::__cxx11::string::~string
                          ((string *)
                           ((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20));
                std::__detail::__variant::
                _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                          ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                           ((long)&type.val.
                                   super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20));
              }
              else {
                std::__detail::__variant::
                _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                          ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                           ((long)&type.val.
                                   super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20));
                bVar2 = ParseInput::takeRParen(this);
                if (bVar2) {
                  ht.id._1_7_ = 0;
                  ht.id._0_1_ = bVar1;
                  _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
                       TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                       ::makeRefType((TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                                      *)local_d0,ht,nullability_00);
                  type.val.
                  super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                  ._M_u._24_1_ = 0;
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)
                             ((long)&type_1.val.
                                     super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                             0x20),"expected end of reftype",local_f0);
                  ParseInput::err((Err *)((long)&type.val.
                                                 super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         + 0x20),this,
                                  (string *)
                                  ((long)&type_1.val.
                                          super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                          .
                                          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                          .
                                          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                  + 0x20));
                  std::__detail::__variant::
                  _Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>::
                  _Variant_storage<2ul,wasm::WATParser::Err>
                            ((_Variant_storage<false,wasm::Type,wasm::WATParser::None,wasm::WATParser::Err>
                              *)((long)&_val.val.
                                        super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        .
                                        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        .
                                        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                + 0x20),
                             (__index_type *)
                             ((long)&type.val.
                                     super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             + 0x20));
                  std::__cxx11::string::~string
                            ((string *)
                             ((long)&type.val.
                                     super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             + 0x20));
                  std::__cxx11::string::~string
                            ((string *)
                             ((long)&type_1.val.
                                     super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                             0x20));
                }
              }
              std::__detail::__variant::
              _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                        ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_d0);
              goto LAB_00a7d199;
            }
            pTStack_120 = (TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                           *)0x5;
            nullability = extraout_EDX_04;
          }
        }
      }
    }
  }
  _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
       TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>::makeRefType
                 (pTStack_120,(HeapTypeT)0x1,nullability);
  type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u._24_1_
       = 0;
LAB_00a7d199:
  if (type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u.
      _24_1_ == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"expected valtype",
               (allocator<char> *)
               ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
    ParseInput::err((Err *)((long)&type.val.
                                   super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20),this,&local_110);
    std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::Type,wasm::WATParser::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&type.val.
                       super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&type.val.
                       super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x20));
    std::__cxx11::string::~string((string *)&local_110);
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err> *)
               ((long)&type.val.
                       super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x20),(_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                        *)((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                  .super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                          0x20));
    if (type_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
                 (string *)
                 ((long)&type.val.
                         super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::WATParser::Err>::
      _Variant_storage<1ul,wasm::WATParser::Err>
                ((_Variant_storage<false,wasm::Type,wasm::WATParser::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)((long)&type.val.
                                   super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)((long)&type.val.
                                   super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20));
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> =
           _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x20) = '\0';
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                     *)((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20))
  ;
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> valtype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i32"sv)) {
    return ctx.makeI32();
  } else if (ctx.in.takeKeyword("i64"sv)) {
    return ctx.makeI64();
  } else if (ctx.in.takeKeyword("f32"sv)) {
    return ctx.makeF32();
  } else if (ctx.in.takeKeyword("f64"sv)) {
    return ctx.makeF64();
  } else if (ctx.in.takeKeyword("v128"sv)) {
    return ctx.makeV128();
  } else if (auto type = reftype(ctx)) {
    CHECK_ERR(type);
    return *type;
  } else {
    return ctx.in.err("expected valtype");
  }
}